

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O1

bitset<256UL> * __thiscall
stored_bitfield::operator_cast_to_bitset
          (bitset<256UL> *__return_storage_ptr__,stored_bitfield *this)

{
  _WordT *p_Var1;
  _WordT *p_Var2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t i;
  long lVar6;
  _Base_bitset<4UL> local_68;
  ulong local_48;
  _WordT a_Stack_40 [3];
  
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = 0;
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
  lVar6 = 0;
  do {
    local_68._M_w[0] = (_WordT)(byte)this[lVar6];
    local_68._M_w[1] = 0;
    local_68._M_w[2] = 0;
    local_68._M_w[3] = 0;
    std::_Base_bitset<4UL>::_M_do_left_shift(&local_68,lVar6 * 8);
    a_Stack_40[1] = local_68._M_w[2];
    a_Stack_40[2] = local_68._M_w[3];
    local_48 = local_68._M_w[0];
    a_Stack_40[0] = local_68._M_w[1];
    lVar5 = 0;
    do {
      uVar3 = a_Stack_40[lVar5];
      p_Var1 = (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w + lVar5;
      uVar4 = p_Var1[1];
      p_Var2 = (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w + lVar5;
      *p_Var2 = *p_Var1 | (&local_48)[lVar5];
      p_Var2[1] = uVar4 | uVar3;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 4);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  return __return_storage_ptr__;
}

Assistant:

operator std::bitset<size>() const {
		
		#define concat(a, b) a##b
		BOOST_STATIC_ASSERT(sizeof(base_type) <= sizeof(concat(unsi, gned) concat(lo, ng)));
		#undef concat
		
		std::bitset<size> result(0);
		for(size_t i = 0; i < count; i++) {
			result |= std::bitset<size>(bits[i]) << (i * base_size);
		}
		return result;
	}